

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O1

void writeKeys<unsigned_int>
               (string *str,vector<unsigned_int,_std::allocator<unsigned_int>_> *keys,
               string *key_type,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  uint __val;
  int *piVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong *puVar7;
  ulong uVar8;
  long *plVar9;
  char cVar10;
  ulong uVar11;
  int *piVar12;
  string *psVar13;
  string __str;
  long *local_e0;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 uStack_a8;
  string *local_a0;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = str;
  local_58 = keys;
  std::operator+(&local_50,"    static constexpr std::array<",key_type);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_68 = *puVar7;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar7;
    local_78 = (ulong *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar11 = n + 1;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar8 = uVar11;
    cVar3 = '\x04';
    do {
      cVar10 = cVar3;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0010bca2;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0010bca2;
      }
      if (uVar8 < 10000) goto LAB_0010bca2;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_0010bca2:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,uVar11);
  uVar11 = CONCAT44(uStack_8c,local_90) + local_70;
  uVar8 = 0xf;
  if (local_78 != &local_68) {
    uVar8 = local_68;
  }
  if (uVar8 < uVar11) {
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar11 <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      goto LAB_0010bd29;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
LAB_0010bd29:
  local_c0 = &local_b0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_b0 = *plVar4;
    uStack_a8 = puVar5[3];
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*puVar5;
  }
  local_b8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0 = &local_d0;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_d0 = *plVar9;
    lStack_c8 = plVar4[3];
  }
  else {
    local_d0 = *plVar9;
    local_e0 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_e0);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  psVar13 = local_a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  piVar12 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar1 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar12 != piVar1) {
    uVar11 = 0;
    do {
      if ((uVar11 != 0) && (uVar11 == (uVar11 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)psVar13);
      }
      if (*piVar12 == -1) {
        std::__cxx11::string::append((char *)psVar13);
      }
      else {
        __val = *(uint *)(*(long *)local_58 + (long)*piVar12 * 4);
        cVar10 = '\x01';
        if (9 < __val) {
          uVar6 = __val;
          cVar3 = '\x04';
          do {
            cVar10 = cVar3;
            if (uVar6 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_0010bf36;
            }
            if (uVar6 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_0010bf36;
            }
            if (uVar6 < 10000) goto LAB_0010bf36;
            bVar2 = 99999 < uVar6;
            uVar6 = uVar6 / 10000;
            cVar3 = cVar10 + '\x04';
          } while (bVar2);
          cVar10 = cVar10 + '\x01';
        }
LAB_0010bf36:
        local_c0 = &local_b0;
        std::__cxx11::string::_M_construct((ulong)&local_c0,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0,(uint)local_b8,__val);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
        psVar13 = local_a0;
        local_e0 = &local_d0;
        plVar9 = plVar4 + 2;
        if ((long *)*plVar4 == plVar9) {
          local_d0 = *plVar9;
          lStack_c8 = plVar4[3];
        }
        else {
          local_d0 = *plVar9;
          local_e0 = (long *)*plVar4;
        }
        *plVar4 = (long)plVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_e0);
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
      }
      uVar11 = uVar11 + 1;
      piVar12 = piVar12 + 1;
    } while (piVar12 != piVar1);
  }
  std::__cxx11::string::append((char *)psVar13);
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<KeyType>& keys,
               std::string key_type,
               const std::vector<int>& mapping,
               size_t n){
    str += "    static constexpr std::array<" + key_type + ", " + std::to_string(n+1) + "> keys {\n        ";

    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row==0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else    str += std::to_string(keys[val]) + ",";
    }
    str += "\n    };\n";
}